

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void google::protobuf::Message::CopyWithSizeCheck(Message *to,Message *from)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *pLVar3;
  undefined4 extraout_var_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[8])(from);
  (*(to->super_MessageLite)._vptr_MessageLite[4])(to);
  iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[8])(from);
  if (CONCAT44(extraout_var,iVar1) != CONCAT44(extraout_var_00,iVar2)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x7e);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (from_size) == (from.ByteSizeLong()): ");
    pLVar3 = internal::LogMessage::operator<<
                       (pLVar3,
                        "Source of CopyFrom changed when clearing target.  Either source is a nested message in target (not allowed), or another thread is modifying the source."
                       );
    internal::LogFinisher::operator=(&local_51,pLVar3);
    internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (*(to->super_MessageLite)._vptr_MessageLite[0x12])(to);
  (**(code **)(CONCAT44(extraout_var_01,iVar1) + 8))(to,from);
  return;
}

Assistant:

void Message::CopyWithSizeCheck(Message* to, const Message& from) {
#ifndef NDEBUG
  size_t from_size = from.ByteSizeLong();
#endif
  to->Clear();
#ifndef NDEBUG
  GOOGLE_CHECK_EQ(from_size, from.ByteSizeLong())
      << "Source of CopyFrom changed when clearing target.  Either "
         "source is a nested message in target (not allowed), or "
         "another thread is modifying the source.";
#endif
  to->GetClassData()->merge_to_from(to, from);
}